

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O3

bool __thiscall cmUVProcessChain::Wait(cmUVProcessChain *this,int64_t milliseconds)

{
  _Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> _Var1;
  uv_loop_t *puVar2;
  bool timeout;
  uv_timer_ptr timer;
  uv_handle_ptr_base_<uv_timer_s> local_28;
  
  local_28.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (-1 < milliseconds) {
    puVar2 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_
                       (&((this->Data)._M_t.
                          super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                          .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>.
                         _M_head_impl)->Loop);
    ::cm::uv_timer_ptr::init((uv_timer_ptr *)&local_28,(EVP_PKEY_CTX *)puVar2);
    ::cm::uv_timer_ptr::start
              ((uv_timer_ptr *)&local_28,Wait::anon_class_1_0_00000001::__invoke,milliseconds,0);
  }
  while (_Var1._M_head_impl =
              (this->Data)._M_t.
              super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
              .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl,
        (ulong)(_Var1._M_head_impl)->ProcessesCompleted <
        (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->Processes + 8) -
                *(long *)&((_Var1._M_head_impl)->Processes).
                          super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
               >> 3)) {
    puVar2 = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&(_Var1._M_head_impl)->Loop);
    uv_run(puVar2,UV_RUN_ONCE);
  }
  ::cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_(&local_28);
  return true;
}

Assistant:

bool cmUVProcessChain::Wait(int64_t milliseconds)
{
  bool timeout = false;
  cm::uv_timer_ptr timer;

  if (milliseconds >= 0) {
    timer.init(*this->Data->Loop, &timeout);
    timer.start(
      [](uv_timer_t* handle) {
        auto* timeoutPtr = static_cast<bool*>(handle->data);
        *timeoutPtr = true;
      },
      milliseconds, 0);
  }

  while (!timeout &&
         this->Data->ProcessesCompleted < this->Data->Processes.size()) {
    uv_run(this->Data->Loop, UV_RUN_ONCE);
  }

  return !timeout;
}